

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O0

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long *in_RSI;
  long in_RDI;
  float fVar2;
  int i;
  float *ptr;
  int q;
  float alphaxlambda;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  int local_160;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_138;
  long local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined8 local_110;
  long local_108;
  int local_fc;
  float local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_d8;
  undefined1 local_c5;
  int local_c4;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a0;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  undefined8 *local_30;
  
  local_e4 = *(int *)((long)in_RSI + 0x2c);
  local_e8 = (int)in_RSI[6];
  local_ec = *(int *)((long)in_RSI + 0x34);
  local_f0 = (int)in_RSI[7];
  local_f4 = local_e4 * local_e8 * local_ec;
  local_f8 = *(float *)(in_RDI + 0xd0) * *(float *)(in_RDI + 0xd4);
  local_d8 = in_RSI;
  for (local_fc = 0; local_fc < local_f0; local_fc = local_fc + 1) {
    local_b8 = &local_150;
    local_64 = *(int *)((long)local_d8 + 0x2c);
    local_68 = (int)local_d8[6];
    local_6c = *(undefined4 *)((long)local_d8 + 0x34);
    local_108 = *local_d8 + local_d8[8] * (long)local_fc * local_d8[2];
    local_80 = local_d8[2];
    local_84 = (undefined4)local_d8[3];
    local_90 = local_d8[4];
    local_60 = &local_150;
    local_50 = (long)local_64 * (long)local_68 * local_80;
    local_b0 = &local_150;
    local_a0 = &local_150;
    local_54 = 0x10;
    local_c4 = local_fc;
    local_c5 = 1;
    local_150 = 0;
    local_140 = 0;
    local_138 = 0;
    local_128 = 0;
    local_124 = 0;
    local_120 = 0;
    local_11c = 0;
    local_118 = 0;
    local_110 = 0;
    local_148 = 0;
    local_78 = local_108;
    local_30 = local_a0;
    local_130 = local_90;
    for (local_160 = 0; local_160 < local_f4; local_160 = local_160 + 1) {
      pfVar1 = (float *)(local_108 + (long)local_160 * 4);
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        *(float *)(local_108 + (long)local_160 * 4) =
             *(float *)(in_RDI + 0xd4) * *(float *)(local_108 + (long)local_160 * 4);
      }
      else {
        fVar2 = expf(*(float *)(local_108 + (long)local_160 * 4));
        *(float *)(local_108 + (long)local_160 * 4) = (fVar2 - 1.0) * local_f8;
      }
    }
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (expf(ptr[i]) - 1.f) * alphaxlambda;
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}